

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O0

Event * __thiscall binlog::EventStream::nextEvent(EventStream *this,EntryStream *input)

{
  Range range_00;
  bool bVar1;
  unsigned_long uVar2;
  long *in_RSI;
  EventStream *in_RDI;
  Range RVar3;
  char *unaff_retaddr;
  EventStream *in_stack_00000050;
  bool special;
  uint64_t tag;
  Range range;
  EventStream *in_stack_ffffffffffffffc0;
  EventStream *pEVar4;
  undefined7 in_stack_ffffffffffffffc8;
  EventStream *this_00;
  char *in_stack_fffffffffffffff8;
  
  this_00 = in_RDI;
  while( true ) {
    RVar3 = (Range)(**(code **)(*in_RSI + 0x10))();
    bVar1 = Range::empty((Range *)&stack0xffffffffffffffd8);
    if (bVar1) {
      return (Event *)0x0;
    }
    uVar2 = Range::read<unsigned_long>((Range *)in_RDI);
    pEVar4 = (EventStream *)RVar3._end;
    bVar1 = (uVar2 & 0x8000000000000000) != 0;
    if (!bVar1) break;
    if (uVar2 == 0xfffffffffffffffd) {
      readClockSync((EventStream *)0xfffffffffffffffd,RVar3);
    }
    else if (uVar2 == 0xfffffffffffffffe) {
      range_00._begin._7_1_ = bVar1;
      range_00._begin._0_7_ = in_stack_ffffffffffffffc8;
      range_00._end = (char *)0xfffffffffffffffe;
      readWriterProp(in_stack_ffffffffffffffc0,range_00);
    }
    else if (uVar2 == 0xffffffffffffffff) {
      readEventSource(in_stack_00000050,_tag);
      in_stack_ffffffffffffffc0 = pEVar4;
    }
  }
  RVar3._end = unaff_retaddr;
  RVar3._begin = in_stack_fffffffffffffff8;
  readEvent(this_00,(uint64_t)in_RSI,RVar3);
  return &in_RDI->_event;
}

Assistant:

const Event* EventStream::nextEvent(EntryStream& input)
{
  while (true)
  {
    Range range = input.nextEntryPayload();
    if (range.empty()) { return nullptr; }

    const std::uint64_t tag = range.read<std::uint64_t>();
    const bool special = (tag & (std::uint64_t(1) << 63)) != 0;

    if (special)
    {
      switch (tag)
      {
        case EventSource::Tag:
          readEventSource(range);
          break;
        case WriterProp::Tag:
          readWriterProp(range);
          break;
        case ClockSync::Tag:
          readClockSync(range);
          break;
        // default: ignore unkown special entries
        // to be forward compatible.
      }
    }
    else
    {
      readEvent(tag, range);
      return &_event;
    }
  }
}